

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::updateClusters(btSoftBody *this)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  Cluster *cluster;
  btVector3 *pbVar5;
  long lVar6;
  float *pfVar7;
  Node **ppNVar8;
  Node *pNVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  long lVar14;
  btDbvtNode *pbVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  btScalar bVar20;
  btScalar bVar21;
  btScalar bVar22;
  btScalar bVar23;
  float fVar24;
  float fVar25;
  btScalar bVar26;
  btScalar bVar28;
  btScalar bVar29;
  undefined1 auVar27 [16];
  btScalar bVar30;
  float fVar31;
  float fVar33;
  undefined1 auVar32 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  btVector3 bVar56;
  btDbvtVolume bounds;
  btMatrix3x3 r;
  btMatrix3x3 s;
  btMatrix3x3 local_168;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  btDbvtVolume local_c8;
  btVector3 local_a0;
  btMatrix3x3 local_90;
  btMatrix3x3 local_60;
  
  CProfileManager::Start_Profile("UpdateClusters");
  iVar13 = (this->m_clusters).m_size;
  if (0 < iVar13) {
    lVar19 = 0;
    do {
      cluster = (this->m_clusters).m_data[lVar19];
      uVar4 = (cluster->m_nodes).m_size;
      uVar18 = (ulong)uVar4;
      if (uVar18 != 0) {
        local_168.m_el[2].m_floats[1] = 0.0;
        local_168.m_el[1].m_floats[2] = 0.0;
        local_168.m_el[1].m_floats[3] = 0.0;
        local_168.m_el[2].m_floats[0] = 0.0;
        local_168.m_el[0].m_floats[1] = 0.0;
        local_168.m_el[0].m_floats[2] = 0.0;
        local_168.m_el[0].m_floats[3] = 0.0;
        local_168.m_el[1].m_floats[0] = 0.0;
        local_168.m_el[0].m_floats[0] = 0.0001;
        local_168.m_el[1].m_floats[1] = 0.0002;
        local_168.m_el[2].m_floats[2] = 0.00029999999;
        local_168.m_el[2].m_floats[3] = 0.0;
        bVar56 = clusterCom(cluster);
        *&(cluster->m_com).m_floats = bVar56.m_floats;
        lVar14 = (long)(cluster->m_nodes).m_size;
        if (0 < lVar14) {
          pbVar5 = (cluster->m_framerefs).m_data;
          local_168.m_el[0].m_floats[0] = 0.0001;
          local_168.m_el[1].m_floats[1] = 0.0002;
          local_168.m_el[2].m_floats[0] = 0.0;
          local_168.m_el[2].m_floats[1] = 0.0;
          lVar17 = 0;
          fVar42 = 0.00029999999;
          do {
            lVar6 = *(long *)((long)(cluster->m_nodes).m_data + lVar17);
            fVar52 = *(float *)(lVar6 + 0x10) - bVar56.m_floats[0];
            fVar47 = *(float *)(lVar6 + 0x14) - bVar56.m_floats[1];
            fVar44 = *(float *)(lVar6 + 0x18) - bVar56.m_floats[2];
            local_168.m_el[0].m_floats[2] =
                 local_168.m_el[0].m_floats[2] +
                 *(float *)((long)pbVar5->m_floats + lVar17 * 2 + 8) * fVar52;
            uVar2 = *(undefined8 *)((long)pbVar5->m_floats + lVar17 * 2);
            local_168.m_el[0].m_floats[0] = local_168.m_el[0].m_floats[0] + fVar52 * (float)uVar2;
            local_168.m_el[0].m_floats[1] =
                 local_168.m_el[0].m_floats[1] + fVar52 * (float)((ulong)uVar2 >> 0x20);
            local_168.m_el[1].m_floats[2] =
                 local_168.m_el[1].m_floats[2] +
                 *(float *)((long)pbVar5->m_floats + lVar17 * 2 + 8) * fVar47;
            uVar2 = *(undefined8 *)((long)pbVar5->m_floats + lVar17 * 2);
            local_168.m_el[1].m_floats[0] = local_168.m_el[1].m_floats[0] + fVar47 * (float)uVar2;
            local_168.m_el[1].m_floats[1] =
                 local_168.m_el[1].m_floats[1] + fVar47 * (float)((ulong)uVar2 >> 0x20);
            fVar42 = fVar42 + *(float *)((long)pbVar5->m_floats + lVar17 * 2 + 8) * fVar44;
            uVar2 = *(undefined8 *)((long)pbVar5->m_floats + lVar17 * 2);
            local_168.m_el[2].m_floats[0] = local_168.m_el[2].m_floats[0] + fVar44 * (float)uVar2;
            local_168.m_el[2].m_floats[1] =
                 local_168.m_el[2].m_floats[1] + fVar44 * (float)((ulong)uVar2 >> 0x20);
            local_168.m_el[2].m_floats[2] = fVar42;
            lVar17 = lVar17 + 8;
          } while (lVar14 * 8 != lVar17);
        }
        if ((PolarDecompose(btMatrix3x3_const&,btMatrix3x3&,btMatrix3x3&)::polar == '\0') &&
           (iVar13 = __cxa_guard_acquire(&PolarDecompose(btMatrix3x3_const&,btMatrix3x3&,btMatrix3x3&)
                                          ::polar), iVar13 != 0)) {
          btPolarDecomposition::btPolarDecomposition
                    ((btPolarDecomposition *)
                     &PolarDecompose(btMatrix3x3_const&,btMatrix3x3&,btMatrix3x3&)::polar,0.0001,
                     0x10);
          __cxa_guard_release(&PolarDecompose(btMatrix3x3_const&,btMatrix3x3&,btMatrix3x3&)::polar);
        }
        btPolarDecomposition::decompose
                  ((btPolarDecomposition *)
                   &PolarDecompose(btMatrix3x3_const&,btMatrix3x3&,btMatrix3x3&)::polar,&local_168,
                   &local_90,&local_60);
        uVar2 = *(undefined8 *)((cluster->m_com).m_floats + 2);
        *(undefined8 *)(cluster->m_framexform).m_origin.m_floats =
             *(undefined8 *)(cluster->m_com).m_floats;
        *(undefined8 *)((cluster->m_framexform).m_origin.m_floats + 2) = uVar2;
        *(undefined8 *)(cluster->m_framexform).m_basis.m_el[0].m_floats =
             local_90.m_el[0].m_floats._0_8_;
        *(undefined8 *)((cluster->m_framexform).m_basis.m_el[0].m_floats + 2) =
             local_90.m_el[0].m_floats._8_8_;
        *(undefined8 *)(cluster->m_framexform).m_basis.m_el[1].m_floats =
             local_90.m_el[1].m_floats._0_8_;
        *(undefined8 *)((cluster->m_framexform).m_basis.m_el[1].m_floats + 2) =
             local_90.m_el[1].m_floats._8_8_;
        *(undefined8 *)(cluster->m_framexform).m_basis.m_el[2].m_floats =
             local_90.m_el[2].m_floats._0_8_;
        *(undefined8 *)((cluster->m_framexform).m_basis.m_el[2].m_floats + 2) =
             local_90.m_el[2].m_floats._8_8_;
        fVar42 = (cluster->m_locii).m_el[1].m_floats[0];
        fVar44 = (cluster->m_locii).m_el[2].m_floats[0];
        fVar47 = (cluster->m_locii).m_el[0].m_floats[0];
        fVar52 = (cluster->m_locii).m_el[0].m_floats[1];
        fVar35 = (cluster->m_locii).m_el[1].m_floats[1];
        fVar38 = (cluster->m_locii).m_el[2].m_floats[1];
        fVar40 = (cluster->m_locii).m_el[0].m_floats[2];
        fVar36 = (cluster->m_locii).m_el[1].m_floats[2];
        fVar41 = (cluster->m_locii).m_el[2].m_floats[2];
        local_118 = ZEXT416((uint)fVar41);
        fVar53 = (cluster->m_framexform).m_basis.m_el[2].m_floats[0];
        fVar43 = (cluster->m_framexform).m_basis.m_el[2].m_floats[1];
        local_f8 = ZEXT416((uint)fVar43);
        fVar1 = (cluster->m_framexform).m_basis.m_el[2].m_floats[2];
        local_108 = ZEXT416((uint)fVar1);
        fVar37 = fVar44 * fVar1 + fVar47 * fVar53 + fVar42 * fVar43;
        fVar24 = fVar38 * fVar1 + fVar52 * fVar53 + fVar35 * fVar43;
        local_e8 = ZEXT416((uint)fVar24);
        fVar39 = fVar41 * fVar1 + fVar40 * fVar53 + fVar36 * fVar43;
        fVar33 = (cluster->m_framexform).m_basis.m_el[0].m_floats[1];
        fVar25 = (cluster->m_framexform).m_basis.m_el[1].m_floats[1];
        local_d8 = CONCAT44(fVar25,fVar33);
        uStack_d0 = 0;
        fVar31 = (cluster->m_framexform).m_basis.m_el[0].m_floats[0];
        fVar34 = (cluster->m_framexform).m_basis.m_el[1].m_floats[0];
        fVar49 = (cluster->m_framexform).m_basis.m_el[0].m_floats[2];
        local_128 = ZEXT416((uint)fVar49);
        fVar51 = (cluster->m_framexform).m_basis.m_el[1].m_floats[2];
        fVar45 = fVar44 * fVar49 + fVar47 * fVar31 + fVar42 * fVar33;
        fVar46 = fVar44 * fVar51 + fVar47 * fVar34 + fVar42 * fVar25;
        fVar48 = fVar38 * fVar49 + fVar52 * fVar31 + fVar35 * fVar33;
        fVar50 = fVar38 * fVar51 + fVar52 * fVar34 + fVar25 * fVar35;
        fVar35 = fVar41 * fVar49 + fVar40 * fVar31 + fVar36 * fVar33;
        fVar36 = fVar41 * fVar51 + fVar40 * fVar34 + fVar25 * fVar36;
        fVar54 = fVar49 * fVar35 + fVar31 * fVar45 + fVar33 * fVar48;
        fVar55 = fVar49 * fVar36 + fVar31 * fVar46 + fVar33 * fVar50;
        local_138 = fVar51 * fVar35 + fVar34 * fVar45 + fVar25 * fVar48;
        fStack_134 = fVar51 * fVar36 + fVar34 * fVar46 + fVar25 * fVar50;
        fVar35 = fVar1 * fVar35 + fVar53 * fVar45 + fVar43 * fVar48;
        fVar36 = fVar1 * fVar36 + fVar53 * fVar46 + fVar43 * fVar50;
        fVar53 = fVar1 * fVar39 + fVar53 * fVar37 + fVar43 * fVar24;
        (cluster->m_invwi).m_el[0].m_floats[0] = fVar54;
        (cluster->m_invwi).m_el[0].m_floats[1] = local_138;
        (cluster->m_invwi).m_el[0].m_floats[2] = fVar35;
        (cluster->m_invwi).m_el[0].m_floats[3] = 0.0;
        fStack_130 = fVar51 * (fVar41 * 0.0 + fVar40 * 0.0 + 0.0) +
                     fVar34 * (fVar44 * 0.0 + fVar47 * 0.0 + fVar42 * 0.0) +
                     fVar25 * (fVar38 * 0.0 + fVar52 * 0.0 + 0.0);
        fStack_12c = fVar51 * (fVar41 * 0.0 + fVar40 * 0.0 + 0.0) +
                     fVar34 * (fVar44 * 0.0 + fVar47 * 0.0 + fVar42 * 0.0) +
                     fVar25 * (fVar38 * 0.0 + fVar52 * 0.0 + 0.0);
        *(ulong *)(cluster->m_invwi).m_el[1].m_floats = CONCAT44(fStack_134,fVar55);
        (cluster->m_invwi).m_el[1].m_floats[2] = fVar36;
        fVar42 = fVar39 * fVar49 + fVar37 * fVar31 + fVar24 * fVar33;
        fVar44 = fVar39 * fVar51 + fVar37 * fVar34 + fVar24 * fVar25;
        (cluster->m_invwi).m_el[1].m_floats[3] = 0.0;
        *(ulong *)(cluster->m_invwi).m_el[2].m_floats = CONCAT44(fVar44,fVar42);
        (cluster->m_invwi).m_el[2].m_floats[2] = fVar53;
        (cluster->m_invwi).m_el[2].m_floats[3] = 0.0;
        (cluster->m_lv).m_floats[0] = 0.0;
        (cluster->m_lv).m_floats[1] = 0.0;
        (cluster->m_lv).m_floats[2] = 0.0;
        (cluster->m_lv).m_floats[3] = 0.0;
        (cluster->m_av).m_floats[0] = 0.0;
        (cluster->m_av).m_floats[1] = 0.0;
        (cluster->m_av).m_floats[2] = 0.0;
        (cluster->m_av).m_floats[3] = 0.0;
        if ((int)uVar4 < 1) {
          fVar40 = 0.0;
          fVar41 = 0.0;
          fVar52 = 0.0;
          fVar47 = 0.0;
          fVar38 = 0.0;
          fVar43 = 0.0;
        }
        else {
          pfVar7 = (cluster->m_masses).m_data;
          ppNVar8 = (cluster->m_nodes).m_data;
          fVar1 = (cluster->m_com).m_floats[0];
          uVar2 = *(undefined8 *)((cluster->m_com).m_floats + 1);
          fVar40 = 0.0;
          fVar41 = 0.0;
          fVar52 = 0.0;
          uVar16 = 0;
          fVar43 = 0.0;
          fVar38 = 0.0;
          fVar47 = 0.0;
          do {
            pNVar9 = ppNVar8[uVar16];
            fVar33 = pfVar7[uVar16];
            uVar3 = *(undefined8 *)(pNVar9->m_v).m_floats;
            fVar25 = (pNVar9->m_v).m_floats[2] * fVar33;
            fVar31 = fVar33 * (float)uVar3;
            fVar33 = fVar33 * (float)((ulong)uVar3 >> 0x20);
            fVar40 = fVar40 + fVar31;
            fVar41 = fVar41 + fVar33;
            *(ulong *)(cluster->m_lv).m_floats = CONCAT44(fVar41,fVar40);
            fVar43 = fVar43 + fVar25;
            (cluster->m_lv).m_floats[2] = fVar43;
            fVar34 = (pNVar9->m_x).m_floats[0] - fVar1;
            uVar3 = *(undefined8 *)((pNVar9->m_x).m_floats + 1);
            fVar49 = (float)uVar3 - (float)uVar2;
            fVar51 = (float)((ulong)uVar3 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
            fVar38 = fVar38 + (fVar25 * fVar49 - fVar33 * fVar51);
            fVar47 = fVar47 + (fVar31 * fVar51 - fVar25 * fVar34);
            fVar52 = fVar52 + (fVar33 * fVar34 - fVar49 * fVar31);
            *(ulong *)(cluster->m_av).m_floats = CONCAT44(fVar47,fVar38);
            (cluster->m_av).m_floats[2] = fVar52;
            uVar16 = uVar16 + 1;
          } while (uVar18 != uVar16);
        }
        fVar1 = cluster->m_imass;
        fVar33 = cluster->m_matching;
        fVar25 = 1.0 - cluster->m_ldamping;
        auVar27._4_4_ = fVar25 * fVar1 * fVar41;
        auVar27._0_4_ = fVar25 * fVar1 * fVar40;
        auVar27._8_4_ = fVar43 * fVar1 * fVar25;
        auVar27._12_4_ = 0;
        *(undefined1 (*) [16])(cluster->m_lv).m_floats = auVar27;
        fVar40 = 1.0 - cluster->m_adamping;
        auVar32._0_4_ = fVar40 * (fVar35 * fVar52 + fVar54 * fVar38 + local_138 * fVar47);
        auVar32._4_4_ = fVar40 * (fVar36 * fVar52 + fVar55 * fVar38 + fStack_134 * fVar47);
        auVar32._8_4_ = fVar40 * (fVar53 * fVar52 + fVar42 * fVar38 + fVar44 * fVar47);
        auVar32._12_4_ = 0;
        *(undefined1 (*) [16])(cluster->m_av).m_floats = auVar32;
        auVar27 = ZEXT416(0);
        *(undefined1 (*) [16])cluster->m_vimpulses[0].m_floats = auVar27;
        *(undefined1 (*) [16])cluster->m_vimpulses[1].m_floats = auVar27;
        *(undefined1 (*) [16])cluster->m_dimpulses[0].m_floats = auVar27;
        *(undefined1 (*) [16])cluster->m_dimpulses[1].m_floats = auVar27;
        cluster->m_nvimpulses = 0;
        cluster->m_ndimpulses = 0;
        if ((0.0 < fVar33) && (0 < (cluster->m_nodes).m_size)) {
          lVar14 = 8;
          lVar17 = 0;
          do {
            pbVar5 = (cluster->m_framerefs).m_data;
            pNVar9 = (cluster->m_nodes).m_data[lVar17];
            fVar42 = *(float *)((long)pbVar5->m_floats + lVar14 + -8);
            fVar44 = *(float *)((long)pbVar5->m_floats + lVar14 + -4);
            fVar47 = *(float *)((long)pbVar5->m_floats + lVar14);
            fVar52 = cluster->m_matching;
            fVar35 = (pNVar9->m_x).m_floats[2];
            uVar2 = *(undefined8 *)(cluster->m_framexform).m_origin.m_floats;
            uVar3 = *(undefined8 *)(pNVar9->m_x).m_floats;
            fVar38 = (float)uVar3;
            fVar40 = (float)((ulong)uVar3 >> 0x20);
            auVar12._4_4_ =
                 fVar52 * (((float)((ulong)uVar2 >> 0x20) +
                           (cluster->m_framexform).m_basis.m_el[1].m_floats[2] * fVar47 +
                           (cluster->m_framexform).m_basis.m_el[1].m_floats[0] * fVar42 +
                           (cluster->m_framexform).m_basis.m_el[1].m_floats[1] * fVar44) - fVar40) +
                 fVar40;
            auVar12._0_4_ =
                 fVar52 * (((float)uVar2 +
                           (cluster->m_framexform).m_basis.m_el[0].m_floats[2] * fVar47 +
                           (cluster->m_framexform).m_basis.m_el[0].m_floats[0] * fVar42 +
                           (cluster->m_framexform).m_basis.m_el[0].m_floats[1] * fVar44) - fVar38) +
                 fVar38;
            auVar12._8_4_ =
                 (((cluster->m_framexform).m_basis.m_el[2].m_floats[2] * fVar47 +
                   (cluster->m_framexform).m_basis.m_el[2].m_floats[0] * fVar42 +
                   (cluster->m_framexform).m_basis.m_el[2].m_floats[1] * fVar44 +
                  (cluster->m_framexform).m_origin.m_floats[2]) - fVar35) * fVar52 + fVar35;
            auVar12._12_4_ = 0;
            *(undefined1 (*) [16])(pNVar9->m_x).m_floats = auVar12;
            lVar17 = lVar17 + 1;
            lVar14 = lVar14 + 0x10;
          } while (lVar17 < (cluster->m_nodes).m_size);
        }
        if (cluster->m_collide == true) {
          ppNVar8 = (cluster->m_nodes).m_data;
          local_c8.mx.m_floats = *&((*ppNVar8)->m_x).m_floats;
          bVar20 = local_c8.mx.m_floats[0];
          bVar21 = local_c8.mx.m_floats[1];
          bVar22 = local_c8.mx.m_floats[2];
          bVar23 = local_c8.mx.m_floats[3];
          local_c8.mi.m_floats = local_c8.mx.m_floats;
          if (1 < (int)uVar4) {
            uVar16 = 1;
            bVar26 = bVar20;
            bVar28 = bVar21;
            bVar29 = bVar22;
            bVar30 = bVar23;
            do {
              auVar27 = *(undefined1 (*) [16])(ppNVar8[uVar16]->m_x).m_floats;
              auVar10._4_4_ = bVar21;
              auVar10._0_4_ = bVar20;
              auVar10._8_4_ = bVar22;
              auVar10._12_4_ = bVar23;
              local_c8.mi.m_floats = (btScalar  [4])minps(auVar27,auVar10);
              auVar11._4_4_ = bVar28;
              auVar11._0_4_ = bVar26;
              auVar11._8_4_ = bVar29;
              auVar11._12_4_ = bVar30;
              local_c8.mx.m_floats = (btScalar  [4])maxps(auVar27,auVar11);
              uVar16 = uVar16 + 1;
              bVar20 = local_c8.mi.m_floats[0];
              bVar21 = local_c8.mi.m_floats[1];
              bVar22 = local_c8.mi.m_floats[2];
              bVar23 = local_c8.mi.m_floats[3];
              bVar26 = local_c8.mx.m_floats[0];
              bVar28 = local_c8.mx.m_floats[1];
              bVar29 = local_c8.mx.m_floats[2];
              bVar30 = local_c8.mx.m_floats[3];
            } while (uVar18 != uVar16);
          }
          if (cluster->m_leaf == (btDbvtNode *)0x0) {
            pbVar15 = btDbvt::insert(&this->m_cdbvt,&local_c8,cluster);
            cluster->m_leaf = pbVar15;
          }
          else {
            fVar42 = (this->m_sst).sdt;
            uVar2 = *(undefined8 *)(cluster->m_lv).m_floats;
            local_a0.m_floats[1] = fVar42 * (float)((ulong)uVar2 >> 0x20) * 3.0;
            local_a0.m_floats[0] = fVar42 * (float)uVar2 * 3.0;
            local_a0.m_floats[2] = (cluster->m_lv).m_floats[2] * fVar42 * 3.0;
            local_a0.m_floats[3] = 0.0;
            btDbvt::update(&this->m_cdbvt,cluster->m_leaf,&local_c8,&local_a0,(this->m_sst).radmrg);
          }
        }
        iVar13 = (this->m_clusters).m_size;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar13);
  }
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void					btSoftBody::updateClusters()
{
	BT_PROFILE("UpdateClusters");
	int i;

	for(i=0;i<m_clusters.size();++i)
	{
		btSoftBody::Cluster&	c=*m_clusters[i];
		const int				n=c.m_nodes.size();
		//const btScalar			invn=1/(btScalar)n;
		if(n)
		{
			/* Frame				*/ 
			const btScalar	eps=btScalar(0.0001);
			btMatrix3x3		m,r,s;
			m[0]=m[1]=m[2]=btVector3(0,0,0);
			m[0][0]=eps*1;
			m[1][1]=eps*2;
			m[2][2]=eps*3;
			c.m_com=clusterCom(&c);
			for(int i=0;i<c.m_nodes.size();++i)
			{
				const btVector3		a=c.m_nodes[i]->m_x-c.m_com;
				const btVector3&	b=c.m_framerefs[i];
				m[0]+=a[0]*b;m[1]+=a[1]*b;m[2]+=a[2]*b;
			}
			PolarDecompose(m,r,s);
			c.m_framexform.setOrigin(c.m_com);
			c.m_framexform.setBasis(r);		
			/* Inertia			*/ 
#if 1/* Constant	*/ 
			c.m_invwi=c.m_framexform.getBasis()*c.m_locii*c.m_framexform.getBasis().transpose();
#else
#if 0/* Sphere	*/ 
			const btScalar	rk=(2*c.m_extents.length2())/(5*c.m_imass);
			const btVector3	inertia(rk,rk,rk);
			const btVector3	iin(btFabs(inertia[0])>SIMD_EPSILON?1/inertia[0]:0,
				btFabs(inertia[1])>SIMD_EPSILON?1/inertia[1]:0,
				btFabs(inertia[2])>SIMD_EPSILON?1/inertia[2]:0);

			c.m_invwi=c.m_xform.getBasis().scaled(iin)*c.m_xform.getBasis().transpose();
#else/* Actual	*/ 		
			c.m_invwi[0]=c.m_invwi[1]=c.m_invwi[2]=btVector3(0,0,0);
			for(int i=0;i<n;++i)
			{
				const btVector3	k=c.m_nodes[i]->m_x-c.m_com;
				const btVector3		q=k*k;
				const btScalar		m=1/c.m_nodes[i]->m_im;
				c.m_invwi[0][0]	+=	m*(q[1]+q[2]);
				c.m_invwi[1][1]	+=	m*(q[0]+q[2]);
				c.m_invwi[2][2]	+=	m*(q[0]+q[1]);
				c.m_invwi[0][1]	-=	m*k[0]*k[1];
				c.m_invwi[0][2]	-=	m*k[0]*k[2];
				c.m_invwi[1][2]	-=	m*k[1]*k[2];
			}
			c.m_invwi[1][0]=c.m_invwi[0][1];
			c.m_invwi[2][0]=c.m_invwi[0][2];
			c.m_invwi[2][1]=c.m_invwi[1][2];
			c.m_invwi=c.m_invwi.inverse();
#endif
#endif
			/* Velocities			*/ 
			c.m_lv=btVector3(0,0,0);
			c.m_av=btVector3(0,0,0);
			{
				int i;

				for(i=0;i<n;++i)
				{
					const btVector3	v=c.m_nodes[i]->m_v*c.m_masses[i];
					c.m_lv	+=	v;
					c.m_av	+=	btCross(c.m_nodes[i]->m_x-c.m_com,v);
				}
			}
			c.m_lv=c.m_imass*c.m_lv*(1-c.m_ldamping);
			c.m_av=c.m_invwi*c.m_av*(1-c.m_adamping);
			c.m_vimpulses[0]	=
				c.m_vimpulses[1]	= btVector3(0,0,0);
			c.m_dimpulses[0]	=
				c.m_dimpulses[1]	= btVector3(0,0,0);
			c.m_nvimpulses		= 0;
			c.m_ndimpulses		= 0;
			/* Matching				*/ 
			if(c.m_matching>0)
			{
				for(int j=0;j<c.m_nodes.size();++j)
				{
					Node&			n=*c.m_nodes[j];
					const btVector3	x=c.m_framexform*c.m_framerefs[j];
					n.m_x=Lerp(n.m_x,x,c.m_matching);
				}
			}			
			/* Dbvt					*/ 
			if(c.m_collide)
			{
				btVector3	mi=c.m_nodes[0]->m_x;
				btVector3	mx=mi;
				for(int j=1;j<n;++j)
				{
					mi.setMin(c.m_nodes[j]->m_x);
					mx.setMax(c.m_nodes[j]->m_x);
				}			
				ATTRIBUTE_ALIGNED16(btDbvtVolume)	bounds=btDbvtVolume::FromMM(mi,mx);
				if(c.m_leaf)
					m_cdbvt.update(c.m_leaf,bounds,c.m_lv*m_sst.sdt*3,m_sst.radmrg);
				else
					c.m_leaf=m_cdbvt.insert(bounds,&c);
			}
		}
	}


}